

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

Var Js::JavascriptFunction::PrototypeEntryPoint(RecyclableObject *function,CallInfo callInfo,...)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  args.super_Arguments.Values = (Type)callInfo;
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x17e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a87f8b;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pJVar1 = (((function->type).ptr)->javascriptLibrary).ptr;
  scriptContext = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((local_38._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x182,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00a87f8b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) == 0) {
    return (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,(PCWSTR)0x0);
}

Assistant:

Var JavascriptFunction::PrototypeEntryPoint(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = function->GetLibrary();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        if (callInfo.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
        }

        return library->GetUndefined();
    }